

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
HdlcSimulationDataGenerator::Crc16
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  value_type local_63 [3];
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> divisor;
  value_type local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stream_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *crc16Ret;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)stream;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,stream);
  local_31 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,&local_31);
  divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
             (value_type *)
             ((long)&divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  local_63[2] = 0x88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,local_63 + 2);
  local_63[1] = 0x10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,local_63 + 1);
  local_63[0] = 0x80;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,local_63);
  CrcDivision(__return_storage_ptr__,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0x10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::Crc16( const vector<U8>& stream )
{
    vector<U8> result = stream;

    // Append 16 0-bits
    result.push_back( 0x00 );
    result.push_back( 0x00 );

    // ISO/IEC 13239:2002(E) page 14
    // CRC16 Divisor (17 bits) - x**16 + x**12 + x**5 + 1 (0x1021)
    vector<U8> divisor;
    divisor.push_back( 0x88 );
    divisor.push_back( 0x10 );
    divisor.push_back( 0x80 );

    vector<U8> crc16Ret = CrcDivision( result, divisor, 16 );

    return crc16Ret;
}